

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall
dtc::fdt::property::parse_cells(property *this,text_input_buffer *input,int cell_size)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  _Elt_pointer psVar1;
  element_type *peVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  uint uVar6;
  bool bVar7;
  _Elt_pointer psVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  ulong *puVar12;
  size_type *psVar13;
  _Elt_pointer psVar14;
  ulong uVar15;
  uint __val;
  uint __len;
  int bit;
  uint uVar16;
  ulong uVar17;
  unsigned_long_long val;
  string referenced;
  string msg;
  ulong local_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  string local_1a0;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  pointer local_160;
  pointer puStack_158;
  pointer local_150;
  value_type local_148;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *local_140;
  ulong local_138;
  uint local_12c;
  undefined1 local_128 [32];
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  pointer local_e8;
  pointer puStack_e0;
  pointer local_d8;
  value_type local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  psVar8 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar8 != (input->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar17 = (ulong)(uint)cell_size;
    psVar1 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    psVar14 = psVar8;
    if (psVar8 == psVar1) {
      psVar14 = (input->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar2 = psVar14[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar10 = peVar2->cursor;
    if (((-1 < (long)iVar10) && (iVar10 < peVar2->size)) && (peVar2->buffer[iVar10] == '<')) {
      input->cursor = input->cursor + 1;
      if (psVar8 == psVar1) {
        psVar8 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      this_00 = &input->input_stack;
      peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar10 = peVar2->cursor + 1;
      peVar2->cursor = iVar10;
      if (peVar2->size <= iVar10) {
        std::
        deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
        ::pop_back(&this_00->c);
      }
      local_48 = 0;
      local_40 = 0;
      local_128._0_8_ = local_128 + 0x10;
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_128,&local_40,&local_40);
      local_108._M_p = (pointer)&local_f8;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_e8 = (pointer)0x0;
      puStack_e0 = (pointer)0x0;
      local_d8 = (pointer)0x0;
      local_d0 = UNKNOWN;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      text_input_buffer::next_token(input);
      local_140 = &this->values;
      local_88 = ~(-1L << ((char)cell_size - 1U & 0x3f));
      local_12c = cell_size << 0x1d | cell_size - 8U >> 3;
      uVar15 = (ulong)local_12c;
      local_138 = uVar17;
      local_80 = uVar17;
      local_78 = uVar15;
      do {
        psVar8 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar8 != (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          psVar1 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar14 = psVar8;
          if (psVar8 == psVar1) {
            psVar14 = (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar2 = psVar14[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar10 = peVar2->cursor;
          if (((-1 < (long)iVar10) && (iVar10 < peVar2->size)) && (peVar2->buffer[iVar10] == '>')) {
            input->cursor = input->cursor + 1;
            if (psVar8 == psVar1) {
              psVar8 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar10 = peVar2->cursor + 1;
            peVar2->cursor = iVar10;
            if (peVar2->size <= iVar10) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
            if (puStack_e0 != local_e8) {
              std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
              push_back(local_140,(value_type *)local_128);
            }
            break;
          }
        }
        text_input_buffer::next_token(input);
        psVar8 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        uVar16 = (uint)uVar17;
        if (psVar8 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00121408:
          bVar7 = text_input_buffer::consume_integer_expression(input,&local_1c8);
          if (bVar7) {
            if (((0x3f < (int)uVar16) || (local_1c8 >> ((byte)local_80 & 0x3f) == 0)) ||
               ((local_1c8 | local_88) == 0xffffffffffffffff)) {
              if (7 < (uint)uVar15) {
                __assert_fail("0 && \"Invalid cell size!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                              ,0x176,
                              "void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
              }
              (*(code *)(&DAT_0013a9ac + *(int *)(&DAT_0013a9ac + local_78 * 4)))();
              return;
            }
            __val = -uVar16;
            if (0 < (int)uVar16) {
              __val = uVar16;
            }
            __len = 1;
            if (__val < 10) goto LAB_001219f8;
            uVar15 = (ulong)__val;
            uVar6 = 4;
            goto LAB_00121936;
          }
          text_input_buffer::parse_error(input,"Expected numbers in array of cells");
LAB_00121903:
          this->valid = false;
          break;
        }
        psVar1 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        psVar14 = psVar8;
        if (psVar8 == psVar1) {
          psVar14 = (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar2 = psVar14[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar10 = peVar2->cursor;
        if ((((long)iVar10 < 0) || (peVar2->size <= iVar10)) || (peVar2->buffer[iVar10] != '&'))
        goto LAB_00121408;
        input->cursor = input->cursor + 1;
        if (psVar8 == psVar1) {
          psVar8 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar10 = peVar2->cursor + 1;
        peVar2->cursor = iVar10;
        if (peVar2->size <= iVar10) {
          std::
          deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
          ::pop_back(&this_00->c);
        }
        if (uVar16 != 0x20) {
          text_input_buffer::parse_error(input,"reference only permitted in 32-bit arrays");
          goto LAB_00121903;
        }
        text_input_buffer::next_token(input);
        local_1c0 = &local_1b0;
        local_1b8 = 0;
        local_1b0 = local_1b0 & 0xffffffffffffff00;
        psVar8 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar8 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00121526:
          text_input_buffer::parse_node_name_abi_cxx11_(&local_1a0,input);
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          psVar1 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar14 = psVar8;
          if (psVar8 == psVar1) {
            psVar14 = (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar2 = psVar14[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar10 = peVar2->cursor;
          if ((((long)iVar10 < 0) || (peVar2->size <= iVar10)) || (peVar2->buffer[iVar10] != '{'))
          goto LAB_00121526;
          input->cursor = input->cursor + 1;
          if (psVar8 == psVar1) {
            psVar8 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar10 = peVar2->cursor + 1;
          peVar2->cursor = iVar10;
          if (peVar2->size <= iVar10) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&this_00->c);
          }
          text_input_buffer::parse_to_abi_cxx11_(&local_1a0,input,'}');
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          psVar8 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar8 != (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            psVar1 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
            psVar14 = psVar8;
            if (psVar8 == psVar1) {
              psVar14 = (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar2 = psVar14[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar10 = peVar2->cursor;
            if (((-1 < (long)iVar10) && (iVar10 < peVar2->size)) && (peVar2->buffer[iVar10] == '}'))
            {
              input->cursor = input->cursor + 1;
              if (psVar8 == psVar1) {
                psVar8 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar2 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar10 = peVar2->cursor + 1;
              peVar2->cursor = iVar10;
              if (peVar2->size <= iVar10) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
          }
        }
        lVar3 = local_1b8;
        if (local_1b8 == 0) {
          text_input_buffer::parse_error(input,"Expected node name");
          this->valid = false;
        }
        else {
          text_input_buffer::next_token(input);
          if (local_e8 != puStack_e0) {
            std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
            push_back(local_140,(value_type *)local_128);
            local_a8 = &local_98;
            local_a0 = 0;
            local_98 = 0;
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_1a0,local_a8);
            local_180 = &local_170;
            local_178 = 0;
            local_170 = 0;
            local_150 = (pointer)0x0;
            local_160 = (pointer)0x0;
            puStack_158 = (pointer)0x0;
            local_148 = UNKNOWN;
            std::__cxx11::string::operator=((string *)local_128,(string *)&local_1a0);
            std::__cxx11::string::operator=((string *)&local_108,(string *)&local_180);
            puVar5 = local_d8;
            puVar4 = local_e8;
            local_e8 = local_160;
            puStack_e0 = puStack_158;
            local_d8 = local_150;
            local_150 = (pointer)0x0;
            local_160 = (pointer)0x0;
            puStack_158 = (pointer)0x0;
            if (puVar4 == (pointer)0x0) {
              local_d0 = local_148;
            }
            else {
              operator_delete(puVar4,(long)puVar5 - (long)puVar4);
              local_d0 = local_148;
              if (local_160 != (pointer)0x0) {
                operator_delete(local_160,(long)local_150 - (long)local_160);
              }
            }
            if (local_180 != &local_170) {
              operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_a8 != &local_98) {
              operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
            }
          }
          std::__cxx11::string::_M_assign((string *)&local_108);
          local_d0 = PHANDLE;
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(local_140,(value_type *)local_128);
          local_c8 = &local_b8;
          local_c0 = 0;
          local_b8 = 0;
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_1a0,local_c8);
          local_180 = &local_170;
          local_178 = 0;
          local_170 = 0;
          local_150 = (pointer)0x0;
          local_160 = (pointer)0x0;
          puStack_158 = (pointer)0x0;
          local_148 = UNKNOWN;
          std::__cxx11::string::operator=((string *)local_128,(string *)&local_1a0);
          std::__cxx11::string::operator=((string *)&local_108,(string *)&local_180);
          puVar5 = local_d8;
          puVar4 = local_e8;
          local_e8 = local_160;
          puStack_e0 = puStack_158;
          local_d8 = local_150;
          local_150 = (pointer)0x0;
          local_160 = (pointer)0x0;
          puStack_158 = (pointer)0x0;
          if (puVar4 == (pointer)0x0) {
            local_d0 = local_148;
            uVar17 = local_138;
          }
          else {
            operator_delete(puVar4,(long)puVar5 - (long)puVar4);
            uVar17 = local_138;
            local_d0 = local_148;
            if (local_160 != (pointer)0x0) {
              operator_delete(local_160,(long)local_150 - (long)local_160);
            }
          }
          uVar15 = (ulong)local_12c;
          if (local_180 != &local_170) {
            operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
          }
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
      } while (lVar3 != 0);
      goto LAB_00121b57;
    }
  }
  __assert_fail("*input == \'<\'",
                "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",0x11b
                ,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
  while( true ) {
    if (uVar11 < 10000) goto LAB_001219f8;
    uVar15 = uVar15 / 10000;
    uVar6 = __len + 4;
    if (uVar11 < 100000) break;
LAB_00121936:
    __len = uVar6;
    uVar11 = (uint)uVar15;
    if (uVar11 < 100) {
      __len = __len - 2;
      goto LAB_001219f8;
    }
    if (uVar11 < 1000) {
      __len = __len - 1;
      goto LAB_001219f8;
    }
  }
  __len = __len + 1;
LAB_001219f8:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - ((char)(uVar17 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_70[0]),__len,__val);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x13afbb);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_1b0 = *puVar12;
    lStack_1a8 = plVar9[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar12;
    local_1c0 = (ulong *)*plVar9;
  }
  local_1b8 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_1a0.field_2._M_allocated_capacity = *psVar13;
    local_1a0.field_2._8_8_ = plVar9[3];
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar13;
    local_1a0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_1a0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  text_input_buffer::parse_error(input,local_1a0._M_dataplus._M_p);
  this->valid = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
LAB_00121b57:
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  return;
}

Assistant:

void
property::parse_cells(text_input_buffer &input, int cell_size)
{
	assert(*input == '<');
	++input;
	property_value v;
	input.next_token();
	while (!input.consume('>'))
	{
		input.next_token();
		// If this is a phandle then we need to get the name of the
		// referenced node
		if (input.consume('&'))
		{
			if (cell_size != 32)
			{
				input.parse_error("reference only permitted in 32-bit arrays");
				valid = false;
				return;
			}
			input.next_token();
			string referenced;
			if (!input.consume('{'))
			{
				referenced = input.parse_node_name();
			}
			else
			{
				referenced = input.parse_to('}');
				input.consume('}');
			}
			if (referenced.empty())
			{
				input.parse_error("Expected node name");
				valid = false;
				return;
			}
			input.next_token();
			// If we already have some bytes, make the phandle a
			// separate component.
			if (!v.byte_data.empty())
			{
				values.push_back(v);
				v = property_value();
			}
			v.string_data = referenced;
			v.type = property_value::PHANDLE;
			values.push_back(v);
			v = property_value();
		}
		else
		{
			//FIXME: We should support labels in the middle
			//of these, but we don't.
			unsigned long long val;
			if (!input.consume_integer_expression(val))
			{
				// FIXME: Distinguish invalid syntax from a
				// number that cannot be represented in an
				// unsigned long long.
				input.parse_error("Expected numbers in array of cells");
				valid = false;
				return;
			}
			// FIXME: No sign information available, so cannot
			// distinguish small negative values from large
			// positive ones, and thus we have to conservatively
			// permit anything that looks like a sign-extended
			// negative integer.
			if (cell_size < 64 && val >= (1ull << cell_size) &&
			    (val | ((1ull << (cell_size - 1)) - 1)) !=
			    std::numeric_limits<unsigned long long>::max())
			{
				std::string msg = "Value does not fit in a " +
					std::to_string(cell_size) + "-bit cell";
				input.parse_error(msg.c_str());
				valid = false;
				return;
			}
			switch (cell_size)
			{
				case 8:
					v.byte_data.push_back(val);
					break;
				case 16:
					push_big_endian(v.byte_data, (uint16_t)val);
					break;
				case 32:
					push_big_endian(v.byte_data, (uint32_t)val);
					break;
				case 64:
					push_big_endian(v.byte_data, (uint64_t)val);
					break;
				default:
					assert(0 && "Invalid cell size!");
			}
			input.next_token();
		}
	}
	// Don't store an empty string value here.
	if (v.byte_data.size() > 0)
	{
		values.push_back(v);
	}
}